

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalarValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)604>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  LogMessage *pLVar7;
  undefined1 *puVar8;
  long *plVar9;
  ulong *puVar10;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ulong uVar11;
  undefined1 *puVar12;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  allocator_type local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Model *local_a8;
  undefined1 local_a0 [56];
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  puVar12 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar12 == (ModelDescription *)0x0) {
    puVar12 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)local_d0);
  local_a0[0] = false;
  local_a0[1] = false;
  local_a0[2] = false;
  local_a0[3] = false;
  local_a8 = format;
  validateModelDescription
            ((Result *)local_68,(ModelDescription *)puVar12,format->specificationversion_,
             (ValidationPolicy *)local_a0);
  local_d0 = local_68;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != local_50) {
    operator_delete(local_60._M_p,local_50[0]._M_allocated_capacity + 1);
  }
  bVar6 = Result::good((Result *)local_d0);
  if (bVar6) {
    local_f0._M_dataplus._M_p = (pointer)0x200000001;
    local_f0._M_string_length._0_4_ = 5;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_f0;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_a0,__l,&local_f1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_68,(CoreML *)&((ModelDescription *)puVar12)->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_a0,
               in_R8);
    local_d0 = local_68;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_p != local_50) {
      operator_delete(local_60._M_p,local_50[0]._M_allocated_capacity + 1);
    }
    pvVar3 = (void *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,local_a0._16_8_ - (long)pvVar3);
    }
    bVar6 = Result::good((Result *)local_d0);
    if (bVar6) {
      local_f0._M_dataplus._M_p = (pointer)0x200000001;
      local_f0._M_string_length._0_4_ = 5;
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&local_f0;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_a0,__l_00,&local_f1);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_68,(CoreML *)&((ModelDescription *)puVar12)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_a0,
                 in_R8);
      local_d0 = local_68;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != local_50) {
        operator_delete(local_60._M_p,local_50[0]._M_allocated_capacity + 1);
      }
      pvVar3 = (void *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,local_a0._16_8_ - (long)pvVar3);
      }
      bVar6 = Result::good((Result *)local_d0);
      if (bVar6) {
        if ((((ModelDescription *)puVar12)->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_a0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_68,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
        }
        pvVar3 = ((((ModelDescription *)puVar12)->input_).super_RepeatedPtrFieldBase.rep_)->elements
                 [0];
        if ((((ModelDescription *)puVar12)->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_68,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_f0,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_68);
        }
        puVar8 = *(undefined1 **)((long)pvVar3 + 0x20);
        if (puVar8 == (undefined1 *)0x0) {
          puVar8 = Specification::_FeatureType_default_instance_;
        }
        pvVar4 = ((((ModelDescription *)puVar12)->output_).super_RepeatedPtrFieldBase.rep_)->
                 elements[0];
        iVar2 = *(int *)(puVar8 + 0x24);
        puVar12 = *(undefined1 **)((long)pvVar4 + 0x20);
        if (puVar12 == (undefined1 *)0x0) {
          puVar12 = Specification::_FeatureType_default_instance_;
        }
        if (iVar2 == 1) {
          if (*(int *)(puVar12 + 0x24) - 1U < 2) {
LAB_00332675:
            if (iVar2 == 5) {
              if (*(int *)(*(long *)(puVar8 + 0x18) + 0x10) == 1) {
                puVar12 = *(undefined1 **)((long)pvVar4 + 0x20);
                if (puVar12 == (undefined1 *)0x0) {
                  puVar12 = Specification::_FeatureType_default_instance_;
                }
                if (*(int *)(puVar12 + 0x24) == 5) {
                  puVar12 = *(undefined1 **)(puVar12 + 0x18);
                }
                else {
                  puVar12 = Specification::_ArrayFeatureType_default_instance_;
                }
                if (*(int *)(puVar12 + 0x10) == 1) {
                  plVar9 = google::protobuf::RepeatedField<long>::Get
                                     ((RepeatedField<long> *)(*(long *)(puVar8 + 0x18) + 0x10),0);
                  puVar12 = *(undefined1 **)((long)pvVar4 + 0x20);
                  if (puVar12 == (undefined1 *)0x0) {
                    puVar12 = Specification::_FeatureType_default_instance_;
                  }
                  if (*(int *)(puVar12 + 0x24) == 5) {
                    puVar12 = *(undefined1 **)(puVar12 + 0x18);
                  }
                  else {
                    puVar12 = Specification::_ArrayFeatureType_default_instance_;
                  }
                  lVar5 = *plVar9;
                  plVar9 = google::protobuf::RepeatedField<long>::Get
                                     ((RepeatedField<long> *)(puVar12 + 0x10),0);
                  if (lVar5 == *plVar9) {
                    if (local_a8->_oneof_case_[0] == 0x25c) {
                      puVar12 = (undefined1 *)(local_a8->Type_).supportvectorclassifier_;
                    }
                    else {
                      puVar12 = Specification::_Scaler_default_instance_;
                    }
                    uVar11 = (ulong)(((SupportVectorClassifier *)puVar12)->
                                    numberofsupportvectorsperclass_).current_size_;
                    if (1 < uVar11) {
                      puVar12 = *(undefined1 **)((long)pvVar3 + 0x20);
                      if (puVar12 == (undefined1 *)0x0) {
                        puVar12 = Specification::_FeatureType_default_instance_;
                      }
                      if (*(int *)(puVar12 + 0x24) == 5) {
                        puVar12 = *(undefined1 **)(puVar12 + 0x18);
                      }
                      else {
                        puVar12 = Specification::_ArrayFeatureType_default_instance_;
                      }
                      puVar10 = (ulong *)google::protobuf::RepeatedField<long>::Get
                                                   ((RepeatedField<long> *)(puVar12 + 0x10),0);
                      if (*puVar10 != uVar11) {
                        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f0,
                                   "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length."
                                   ,"");
                        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
                        goto LAB_003328ca;
                      }
                    }
                    if (local_a8->_oneof_case_[0] == 0x25c) {
                      puVar12 = (undefined1 *)(local_a8->Type_).scaler_;
                    }
                    else {
                      puVar12 = Specification::_Scaler_default_instance_;
                    }
                    uVar11 = (ulong)(((Scaler *)puVar12)->scalevalue_).current_size_;
                    if (1 < uVar11) {
                      puVar12 = *(undefined1 **)((long)pvVar3 + 0x20);
                      if (puVar12 == (undefined1 *)0x0) {
                        puVar12 = Specification::_FeatureType_default_instance_;
                      }
                      if (*(int *)(puVar12 + 0x24) == 5) {
                        puVar12 = *(undefined1 **)(puVar12 + 0x18);
                      }
                      else {
                        puVar12 = Specification::_ArrayFeatureType_default_instance_;
                      }
                      puVar10 = (ulong *)google::protobuf::RepeatedField<long>::Get
                                                   ((RepeatedField<long> *)(puVar12 + 0x10),0);
                      if (*puVar10 != uVar11) {
                        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f0,
                                   "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length."
                                   ,"");
                        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
                        goto LAB_003328ca;
                      }
                    }
                    goto LAB_00332746;
                  }
                }
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,
                           "Shape of output array does not match shape of input array.","");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
              }
              else {
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,
                           "Only 1 dimensional arrays input features are supported by the scaler.",
                           "");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
              }
            }
            else {
              if (local_a8->_oneof_case_[0] == 0x25c) {
                puVar12 = (undefined1 *)(local_a8->Type_).textclassifier_;
              }
              else {
                puVar12 = Specification::_Scaler_default_instance_;
              }
              if (*(uint *)&(((TextClassifier *)puVar12)->language_).tagged_ptr_.ptr_ < 2) {
                if (((TextClassifier *)puVar12)->revision_ < 2) goto LAB_00332746;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,
                           "For input type array, specified scale values must be empty or a scalar."
                           ,"");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
              }
              else {
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,
                           "For a scalar imput type, specified shift value must be empty or a scalar."
                           ,"");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
              }
            }
          }
          else {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Input type Int64 must output to Int64 or Double.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
          }
        }
        else {
          if (*(int *)(puVar12 + 0x24) == iVar2) goto LAB_00332675;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,
                     "Type of input feature does not match the output type feature.","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
        }
LAB_003328ca:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00332794;
      }
    }
  }
LAB_00332746:
  __return_storage_ptr__->m_type = local_d0._0_4_;
  __return_storage_ptr__->m_reason = local_d0._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p == &local_b8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_b8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_c8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_c0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_c8._M_p = (pointer)&local_b8;
LAB_00332794:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_scaler>(const Specification::Model& format) {
        const auto& description = format.description();

            // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];

        if(input.type().Type_case() == FT::kInt64Type) {
            if((output.type().Type_case() != FT::kInt64Type)
               && (output.type().Type_case() != FT::kDoubleType)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Input type Int64 must output to Int64 or Double.");
            }
        } else if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }

            // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Only 1 dimensional arrays input features are supported by the scaler.");
            }

            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                               "Shape of output array does not match shape of input array.");
            }

            // Now, make sure that the repeated values make sense.
            int64_t shift_size = static_cast<int64_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1
                 || shift_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length.");
            }

                // Now, make sure that the repeated values make sense.
            int64_t scale_size = static_cast<int64_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1
                 || scale_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length.");
            }
        } else {
                // Now, make sure that the repeated values make sense.
            size_t shift_size = static_cast<size_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For a scalar imput type, specified shift value must be empty or a scalar.");
            }

                // Now, make sure that the repeated values make sense.
            size_t scale_size = static_cast<size_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty or a scalar.");
            }
        }

        return result;
    }